

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O1

int equal_email(uchar *a,size_t a_len,uchar *b,size_t b_len,uint unused_flags)

{
  uchar *puVar1;
  uchar *puVar2;
  int iVar3;
  uint uVar4;
  uchar *puVar5;
  size_t i;
  uchar *puVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  
  if (a_len != b_len) {
    return 0;
  }
  sVar9 = 0;
  puVar1 = a + -1;
  puVar2 = b + -1;
  uVar8 = 0;
  do {
    uVar7 = uVar8;
    puVar6 = puVar2;
    puVar5 = puVar1;
    if (a_len == uVar7) goto LAB_0021d8c2;
    uVar8 = uVar7;
    if (puVar5[a_len] == '@') break;
    uVar8 = uVar7 + 1;
    puVar1 = puVar5 + -1;
    puVar2 = puVar6 + -1;
  } while (puVar6[a_len] != '@');
  iVar3 = equal_nocase(puVar5 + a_len,uVar7 + 1,puVar6 + a_len,uVar7 + 1,(uint)uVar8);
  if (iVar3 == 0) {
    uVar4 = 0;
  }
  else {
    sVar9 = ~uVar7 + a_len;
LAB_0021d8c2:
    if (sVar9 != 0) {
      a_len = sVar9;
    }
    if (a_len == 0) {
      uVar4 = 1;
    }
    else {
      iVar3 = bcmp(a,b,a_len);
      uVar4 = (uint)(iVar3 == 0);
    }
  }
  return uVar4;
}

Assistant:

static int equal_email(const unsigned char *a, size_t a_len,
                       const unsigned char *b, size_t b_len,
                       unsigned int unused_flags) {
  size_t i = a_len;
  if (a_len != b_len) {
    return 0;
  }
  // We search backwards for the '@' character, so that we do not have to
  // deal with quoted local-parts.  The domain part is compared in a
  // case-insensitive manner.
  while (i > 0) {
    --i;
    if (a[i] == '@' || b[i] == '@') {
      if (!equal_nocase(a + i, a_len - i, b + i, a_len - i, 0)) {
        return 0;
      }
      break;
    }
  }
  if (i == 0) {
    i = a_len;
  }
  return equal_case(a, i, b, i, 0);
}